

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O0

bool cmFileTimes::Copy(string *fromFile,string *toFile)

{
  bool bVar1;
  bool local_39;
  cmFileTimes local_20;
  cmFileTimes fileTimes;
  string *toFile_local;
  string *fromFile_local;
  
  fileTimes.times._M_t.
  super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
  super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
  super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl =
       (unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>)
       (unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>)toFile;
  cmFileTimes(&local_20);
  bVar1 = Load(&local_20,fromFile);
  local_39 = false;
  if (bVar1) {
    local_39 = Store(&local_20,
                     (string *)
                     fileTimes.times._M_t.
                     super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
                     .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl);
  }
  ~cmFileTimes(&local_20);
  return local_39;
}

Assistant:

bool cmFileTimes::Copy(std::string const& fromFile, std::string const& toFile)
{
  cmFileTimes fileTimes;
  return (fileTimes.Load(fromFile) && fileTimes.Store(toFile));
}